

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validate.cpp
# Opt level: O0

void __thiscall Validate::PrintSuccessMessage(Validate *this)

{
  Validate *this_local;
  
  fprintf(_stderr,"INFO: All %s file validation checks have passed.",this->fileDescription_);
  if ((this->warnings_ & 1U) != 0) {
    fprintf(_stderr," Please take note of any warnings.");
  }
  fprintf(_stderr,"\n");
  return;
}

Assistant:

void Validate::PrintSuccessMessage() {
/* Only print message regarding warnings if relevant. Some validation checks do
 * not produce any warning messages. */

  fprintf(stderr, "INFO: All %s file validation checks have passed.",
	  fileDescription_);
  if (warnings_) {
    fprintf(stderr, " Please take note of any warnings.");
  }
  fprintf(stderr, "\n");

}